

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
DynamicHistogram<double>::pdf
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          DynamicHistogram<double> *this)

{
  double *pdVar1;
  int iVar2;
  double *pdVar3;
  runtime_error *this_00;
  pointer pdVar4;
  double dVar5;
  allocator_type local_19;
  value_type_conflict3 local_18;
  
  iVar2 = (*this->_vptr_DynamicHistogram[2])(this);
  if ((char)iVar2 != '\0') {
    local_18 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (__return_storage_ptr__,(long)this->_binCount,&local_18,&local_19);
    dVar5 = total(this);
    pdVar3 = (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar3 != pdVar1) {
      pdVar4 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_start;
      do {
        *pdVar4 = *pdVar3 / dVar5;
        pdVar4 = pdVar4 + 1;
        pdVar3 = pdVar3 + 1;
      } while (pdVar3 != pdVar1);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"DynamicHistogram::pdf - Histogram could not be initialized.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<double>
    pdf()
    {
        if (!this->merge()) throw std::runtime_error("DynamicHistogram::pdf - Histogram could not be initialized.");

        std::vector<double> prob(this->count_(),0);

        double sum = this->total();

        std::vector<double>::iterator dist = prob.begin();
        for (std::vector<double>::const_iterator freq = this->_frequencies.begin(); freq != this->_frequencies.end(); ++freq)
        {
            *dist = (*freq) / sum;
            dist++;
        }

        return prob;

    }